

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void HuffmanTree_cleanup(HuffmanTree *tree)

{
  lodepng_free((void *)0x2ba031);
  lodepng_free((void *)0x2ba03e);
  lodepng_free((void *)0x2ba04b);
  return;
}

Assistant:

static void HuffmanTree_cleanup(HuffmanTree* tree)
{
  lodepng_free(tree->tree2d);
  lodepng_free(tree->tree1d);
  lodepng_free(tree->lengths);
}